

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRuntimeFail.cpp
# Opt level: O3

void __thiscall Test_testGlobalOverflow::Run(Test_testGlobalOverflow *this)

{
  nullres nVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char buf [512];
  char local_218;
  char cStack_217;
  char cStack_216;
  char cStack_215;
  char cStack_214;
  char cStack_213;
  char cStack_212;
  char cStack_211;
  char cStack_210;
  char cStack_20f;
  char cStack_20e;
  char cStack_20d;
  char cStack_20c;
  char cStack_20b;
  char cStack_20a;
  char cStack_209;
  char local_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  undefined1 local_19;
  
  nullcClean();
  nullcSetExecutorStackSize(0x8000);
  if (Tests::messageVerbose == '\x01') {
    puts("Global overflow test\r");
  }
  if (DAT_003e9490 == '\x01') {
    testsCount[1] = testsCount[1] + 1;
    nullcSetExecutor(1);
    nVar1 = nullcBuild(testGlobalOverflow);
    if (nVar1 == '\0') {
      __assert_fail("good",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestRuntimeFail.cpp"
                    ,0x220,"virtual void Test_testGlobalOverflow::Run()");
    }
    nVar1 = nullcRun();
    if (nVar1 == '\0') {
      pcVar2 = nullcGetLastError();
      pcVar2 = strstr(pcVar2,"ERROR:");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = nullcGetLastError();
      }
      strncpy(&local_218,pcVar2,0x1ff);
      local_19 = 0;
      pcVar2 = strchr(&local_218,0xd);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      auVar4[0] = -(local_208 == ' ');
      auVar4[1] = -(cStack_207 == 's');
      auVar4[2] = -(cStack_206 == 't');
      auVar4[3] = -(cStack_205 == 'a');
      auVar4[4] = -(cStack_204 == 'c');
      auVar4[5] = -(cStack_203 == 'k');
      auVar4[6] = -(cStack_202 == ' ');
      auVar4[7] = -(cStack_201 == 'o');
      auVar4[8] = -(cStack_200 == 'v');
      auVar4[9] = -(cStack_1ff == 'e');
      auVar4[10] = -(cStack_1fe == 'r');
      auVar4[0xb] = -(cStack_1fd == 'f');
      auVar4[0xc] = -(cStack_1fc == 'l');
      auVar4[0xd] = -(cStack_1fb == 'o');
      auVar4[0xe] = -(cStack_1fa == 'w');
      auVar4[0xf] = -(cStack_1f9 == '\0');
      auVar3[0] = -(local_218 == 'E');
      auVar3[1] = -(cStack_217 == 'R');
      auVar3[2] = -(cStack_216 == 'R');
      auVar3[3] = -(cStack_215 == 'O');
      auVar3[4] = -(cStack_214 == 'R');
      auVar3[5] = -(cStack_213 == ':');
      auVar3[6] = -(cStack_212 == ' ');
      auVar3[7] = -(cStack_211 == 'a');
      auVar3[8] = -(cStack_210 == 'l');
      auVar3[9] = -(cStack_20f == 'l');
      auVar3[10] = -(cStack_20e == 'o');
      auVar3[0xb] = -(cStack_20d == 'c');
      auVar3[0xc] = -(cStack_20c == 'a');
      auVar3[0xd] = -(cStack_20b == 't');
      auVar3[0xe] = -(cStack_20a == 'e');
      auVar3[0xf] = -(cStack_209 == 'd');
      auVar3 = auVar3 & auVar4;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
        testsPassed[1] = testsPassed[1] + 1;
      }
      else {
        if (Tests::messageVerbose == '\0') {
          puts("Global overflow test\r");
        }
        printf("X86 failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n",&local_218,
               "ERROR: allocated stack overflow");
      }
    }
    else {
      if (Tests::messageVerbose == '\0') {
        puts("Global overflow test\r");
      }
      puts("Test should have failed.\r");
    }
  }
  nullcClean();
  nullcSetExecutorStackSize(Tests::testStackSize);
  return;
}

Assistant:

virtual void Run()
	{
		nullcClean();
		nullcSetExecutorStackSize(32 * 1024);

		if(Tests::messageVerbose)
			printf("Global overflow test\r\n");

		if(Tests::testFailureExecutor[TEST_TYPE_X86])
		{
			testsCount[TEST_TYPE_X86]++;
			nullcSetExecutor(NULLC_X86);
			nullres good = nullcBuild(testGlobalOverflow);
			assert(good);
			good = nullcRun();
			if(!good)
			{
				const char *expected = "ERROR: allocated stack overflow";
				char buf[512];

				if(const char *pos = strstr(nullcGetLastError(), "ERROR:"))
					strncpy(buf, pos, 511);
				else
					strncpy(buf, nullcGetLastError(), 511);

				buf[511] = 0;

				if(char *lineEnd = strchr(buf, '\r'))
					*lineEnd = 0;
				if(strcmp(expected, buf) != 0)
				{
					if(!Tests::messageVerbose)
						printf("Global overflow test\r\n");
					printf("X86 failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", buf, expected);
				}else{
					testsPassed[TEST_TYPE_X86]++;
				}
			}else{
				if(!Tests::messageVerbose)
					printf("Global overflow test\r\n");
				printf("Test should have failed.\r\n");
			}
		}

		nullcClean();
		nullcSetExecutorStackSize(Tests::testStackSize);
	}